

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::python::GetFileName_abi_cxx11_
          (string *__return_storage_ptr__,python *this,FileDescriptor *file_des,string_view suffix)

{
  string_view pc;
  Nonnull<std::string_*> target;
  FixedMapping replacements;
  string_view filename_00;
  AlphaNum local_d0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_a0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_80;
  undefined8 local_78;
  undefined1 local_59;
  string_view local_58;
  undefined1 local_48 [8];
  string module_name;
  FileDescriptor *file_des_local;
  string_view suffix_local;
  string *filename;
  
  target = (Nonnull<std::string_*>)suffix._M_len;
  module_name.field_2._8_8_ = this;
  local_58 = FileDescriptor::name((FileDescriptor *)this);
  filename_00._M_str = (char *)target;
  filename_00._M_len = (size_t)local_58._M_str;
  ModuleName_abi_cxx11_((string *)local_48,(python *)local_58._M_len,filename_00);
  local_59 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_48);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_a0,(char (*) [2])0x2073f9e,(char (*) [2])0x20204c1);
  local_80 = &local_a0;
  local_78 = 1;
  replacements._M_len = (size_type)__return_storage_ptr__;
  replacements._M_array = (iterator)0x1;
  absl::lts_20250127::StrReplaceAll((lts_20250127 *)local_80,replacements,target);
  pc._M_str = (char *)suffix._M_len;
  pc._M_len = (size_t)file_des;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_d0,pc);
  absl::lts_20250127::StrAppend(__return_storage_ptr__,&local_d0);
  local_59 = 1;
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFileName(const FileDescriptor* file_des,
                        absl::string_view suffix) {
  std::string module_name = ModuleName(file_des->name());
  std::string filename = module_name;
  absl::StrReplaceAll({{".", "/"}}, &filename);
  absl::StrAppend(&filename, suffix);
  return filename;
}